

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URResolution.cpp
# Opt level: O3

void __thiscall
Inferences::URResolution::Item::resolveLiteral
          (Item *this,uint idx,
          QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause> *unif,
          Clause *premise,bool useQuerySubstitution)

{
  Color CVar1;
  Literal **ppLVar2;
  ResultSubstitution *pRVar3;
  int iVar4;
  uint uVar5;
  Literal *pLVar6;
  Literal *pLVar7;
  Literal *pLVar8;
  AnswerLiteralManager *pAVar9;
  undefined4 extraout_var;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  
  ppLVar2 = (this->_lits)._stack;
  pLVar8 = ppLVar2[idx];
  ppLVar2[idx] = (Literal *)0x0;
  (this->_premises)._array[idx] = premise;
  CVar1 = this->_color;
  uVar12 = (uint)*(undefined8 *)&premise->field_0x38;
  if ((~uVar12 & 0x300000) == 0) {
    Kernel::Clause::computeColor(premise);
    uVar12 = (uint)*(undefined8 *)&premise->field_0x38;
  }
  this->_color = uVar12 >> 0x14 & COLOR_INVALID | CVar1;
  pLVar6 = this->_ansLit;
  if (pLVar6 != (Literal *)0x0) {
    iVar4 = 0;
    if (*(int *)&(pLVar6->super_Term).field_0xc < 0) {
      iVar4 = 0;
      do {
        pLVar6 = *(Literal **)&(pLVar6->super_Term).field_9._vars;
        if (((ulong)pLVar6 & 1) != 0) {
          uVar12 = 3;
          goto LAB_005147b0;
        }
        iVar4 = iVar4 + 2;
      } while (*(int *)&(pLVar6->super_Term).field_0xc < 0);
    }
    uVar12 = (pLVar6->super_Term).field_9._vars;
LAB_005147b0:
    if (iVar4 + uVar12 != 0) {
      lVar11 = 0x30;
      if (useQuerySubstitution) {
        lVar11 = 0x18;
      }
      pLVar6 = (Literal *)
               (**(code **)((long)((unif->unifier)._obj)->_vptr_ResultSubstitution + lVar11))();
      this->_ansLit = pLVar6;
    }
  }
  if ((*(int *)(Lib::env + 0x8898) == 2) &&
     (pLVar6 = Kernel::Clause::getAnswerLiteral(premise), pLVar6 != (Literal *)0x0)) {
    pLVar7 = Kernel::Clause::getAnswerLiteral(premise);
    iVar4 = 0;
    pLVar6 = pLVar7;
    if (*(int *)&(pLVar7->super_Term).field_0xc < 0) {
      iVar4 = 0;
      do {
        pLVar6 = *(Literal **)&(pLVar6->super_Term).field_9._vars;
        if (((ulong)pLVar6 & 1) != 0) {
          uVar12 = 3;
          goto LAB_00514834;
        }
        iVar4 = iVar4 + 2;
      } while (*(int *)&(pLVar6->super_Term).field_0xc < 0);
    }
    uVar12 = (pLVar6->super_Term).field_9._vars;
LAB_00514834:
    if (iVar4 + uVar12 != 0) {
      pRVar3 = (unif->unifier)._obj;
      lVar11 = 0x18;
      if (useQuerySubstitution) {
        lVar11 = 0x30;
      }
      pLVar7 = (Literal *)
               (**(code **)((long)pRVar3->_vptr_ResultSubstitution + lVar11))(pRVar3,pLVar7);
    }
    if (this->_ansLit != (Literal *)0x0) {
      if (this->_ansLit == pLVar7) goto LAB_005148cf;
      uVar10 = (pLVar8->super_Term)._args[0]._content;
      pRVar3 = (unif->unifier)._obj;
      lVar11 = 0x30;
      if (useQuerySubstitution) {
        lVar11 = 0x18;
      }
      pLVar8 = (Literal *)
               (**(code **)((long)pRVar3->_vptr_ResultSubstitution + lVar11))(pRVar3,pLVar8);
      if ((uVar10 & 4) == 0) {
        pLVar8 = Kernel::Literal::complementaryLiteral(pLVar8);
      }
      pAVar9 = Shell::AnswerLiteralManager::getInstance();
      pLVar6 = this->_ansLit;
      if ((uVar10 & 4) == 0) {
        pLVar6 = pLVar7;
        pLVar7 = this->_ansLit;
      }
      iVar4 = (*pAVar9->_vptr_AnswerLiteralManager[5])(pAVar9,pLVar8,pLVar7,pLVar6);
      pLVar7 = (Literal *)CONCAT44(extraout_var,iVar4);
    }
    this->_ansLit = pLVar7;
  }
LAB_005148cf:
  if (this->_atMostOneNonGround == false) {
    uVar10 = (ulong)((long)(this->_lits)._cursor - (long)(this->_lits)._stack) >> 3;
    if ((int)uVar10 == 0) {
      bVar14 = true;
    }
    else {
      lVar11 = 0x30;
      if (useQuerySubstitution) {
        lVar11 = 0x18;
      }
      uVar13 = 0;
      uVar12 = 0;
      do {
        ppLVar2 = (this->_lits)._stack;
        if (ppLVar2[uVar13] != (Literal *)0x0) {
          pLVar8 = (Literal *)
                   (**(code **)((long)((unif->unifier)._obj)->_vptr_ResultSubstitution + lVar11))();
          ppLVar2[uVar13] = pLVar8;
          iVar4 = 0;
          if (*(int *)&(pLVar8->super_Term).field_0xc < 0) {
            iVar4 = 0;
            do {
              pLVar8 = *(Literal **)&(pLVar8->super_Term).field_9._vars;
              if (((ulong)pLVar8 & 1) != 0) {
                uVar5 = 3;
                goto LAB_00514940;
              }
              iVar4 = iVar4 + 2;
            } while (*(int *)&(pLVar8->super_Term).field_0xc < 0);
          }
          uVar5 = (pLVar8->super_Term).field_9._vars;
LAB_00514940:
          uVar12 = uVar12 + (iVar4 + uVar5 != 0);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != (uVar10 & 0xffffffff));
      bVar14 = uVar12 < 2;
    }
    this->_atMostOneNonGround = bVar14;
  }
  return;
}

Assistant:

void resolveLiteral(unsigned idx, QueryRes<ResultSubstitutionSP, LiteralClause>& unif, Clause* premise, bool useQuerySubstitution)
  {
    Literal* rlit = _lits[idx];
    _lits[idx] = 0;
    _premises[idx] = premise;
    _color = static_cast<Color>(_color | premise->color());
    ASS_NEQ(_color, COLOR_INVALID)

    if (_ansLit && !_ansLit->ground()) {
      _ansLit = unif.unifier->apply(_ansLit, !useQuerySubstitution);
    }
    bool synthesis = (env.options->questionAnswering() == Options::QuestionAnsweringMode::SYNTHESIS);
    if (synthesis && premise->hasAnswerLiteral()) {
      Literal* premAnsLit = premise->getAnswerLiteral();
      if (!premAnsLit->ground()) {
        premAnsLit = unif.unifier->apply(premAnsLit, useQuerySubstitution);
      }
      if (!_ansLit) {
        _ansLit = premAnsLit;
      } else if (_ansLit != premAnsLit) {
        bool neg = rlit->isNegative();
        Literal* resolved = unif.unifier->apply(rlit, !useQuerySubstitution);
        if (neg) {
          resolved = Literal::complementaryLiteral(resolved);
        }
        _ansLit = AnswerLiteralManager::getInstance()->makeITEAnswerLiteral(resolved, neg ? _ansLit : premAnsLit, neg ? premAnsLit : _ansLit);
      }
    }

    if(_atMostOneNonGround) {
      return;
    }

    unsigned nonGroundCnt = 0;
    unsigned clen = _lits.size();
    for(unsigned i=0; i<clen; i++) {
      Literal*& lit = _lits[i];
      if(!lit) {
        continue;
      }
      lit = unif.unifier->apply(lit, !useQuerySubstitution);
      if(!lit->ground()) {
        nonGroundCnt++;
      }
    }
    _atMostOneNonGround = nonGroundCnt<=1;
  }